

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O0

cupdlp_int csc_copy(CUPDLPcsc *dst,CUPDLPcsc *src)

{
  undefined4 *in_RSI;
  undefined4 *in_RDI;
  
  *in_RDI = *in_RSI;
  in_RDI[1] = in_RSI[1];
  in_RDI[2] = in_RSI[2];
  memcpy(*(void **)(in_RDI + 4),*(void **)(in_RSI + 4),(long)(in_RSI[1] + 1) << 2);
  memcpy(*(void **)(in_RDI + 6),*(void **)(in_RSI + 6),(long)(int)in_RSI[2] << 2);
  memcpy(*(void **)(in_RDI + 8),*(void **)(in_RSI + 8),(long)(int)in_RSI[2] << 3);
  return 0;
}

Assistant:

cupdlp_int csc_copy(CUPDLPcsc *dst, CUPDLPcsc *src) {
  dst->nRows = src->nRows;
  dst->nCols = src->nCols;
  dst->nMatElem = src->nMatElem;
  CUPDLP_COPY_VEC(dst->colMatBeg, src->colMatBeg, cupdlp_int, src->nCols + 1);
  CUPDLP_COPY_VEC(dst->colMatIdx, src->colMatIdx, cupdlp_int, src->nMatElem);
  CUPDLP_COPY_VEC(dst->colMatElem, src->colMatElem, cupdlp_float,
                  src->nMatElem);

#ifndef CUPDLP_CPU
  // Pointer to GPU csc matrix
  CHECK_CUSPARSE(cusparseCreateCsc(
      &dst->cuda_csc, src->nRows, src->nCols, src->nMatElem, dst->colMatBeg,
      dst->colMatIdx, dst->colMatElem, CUSPARSE_INDEX_32I, CUSPARSE_INDEX_32I,
      CUSPARSE_INDEX_BASE_ZERO, CudaComputeType));
#endif

  return 0;
}